

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void __thiscall
DriverTest_HttpRange_Test::~DriverTest_HttpRange_Test(DriverTest_HttpRange_Test *this)

{
  DriverTest_HttpRange_Test *this_local;
  
  DriverTest::~DriverTest(&this->super_DriverTest);
  return;
}

Assistant:

TEST_P(DriverTest, HttpRange)
{
    Arbiter a;

    const std::string root(GetParam());
    const std::string path(root + "range.txt");
    const std::string data("0123456789");

    const std::size_t x(2);
    const std::size_t y(8);
    const http::Headers headers{
        // The range header is inclusive of the end, so subtract 1 here.
        { "Range", "bytes=" + std::to_string(x) + "-" + std::to_string(y - 1) }
    };

    if (!a.isHttpDerived(root)) return;

    EXPECT_NO_THROW(a.put(path, data));
    EXPECT_EQ(a.get(path, headers), data.substr(x, y - x));
}